

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_refs.c
# Opt level: O1

RK_S32 mpp_hevc_frame_nb_refs(HEVCContext *s)

{
  ShortTermRPS *pSVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  RK_U8 *pRVar5;
  ulong uVar6;
  
  iVar2 = 0;
  if ((s->sh).slice_type != I_SLICE) {
    pSVar1 = (s->sh).short_term_rps;
    if (pSVar1 == (ShortTermRPS *)0x0) {
      iVar2 = 0;
    }
    else {
      uVar3 = pSVar1->num_negative_pics;
      uVar4 = (ulong)uVar3;
      if (uVar4 == 0) {
        uVar3 = 0;
        iVar2 = 0;
      }
      else {
        uVar6 = 0;
        iVar2 = 0;
        do {
          iVar2 = (iVar2 + 1) - (uint)(pSVar1->used[uVar6] == '\0');
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      if ((int)uVar3 < pSVar1->num_delta_pocs) {
        pRVar5 = pSVar1->used + uVar4;
        do {
          iVar2 = (iVar2 + 1) - (uint)(*pRVar5 == '\0');
          pRVar5 = pRVar5 + 1;
          uVar3 = (int)uVar4 + 1;
          uVar4 = (ulong)uVar3;
        } while ((int)uVar3 < pSVar1->num_delta_pocs);
      }
    }
    uVar4 = (ulong)(s->sh).long_term_rps.nb_refs;
    if (uVar4 != 0) {
      uVar6 = 0;
      do {
        iVar2 = (iVar2 + 1) - (uint)((s->sh).long_term_rps.used[uVar6] == '\0');
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
  }
  return iVar2;
}

Assistant:

int mpp_hevc_frame_nb_refs(HEVCContext *s)
{
    RK_S32 ret = 0;
    RK_S32 i;
    const ShortTermRPS *rps = s->sh.short_term_rps;
    LongTermRPS *long_rps   = &s->sh.long_term_rps;

    if (s->sh.slice_type == I_SLICE) {
        return 0;
    }
    if (rps) {
        for (i = 0; (RK_U32)i < rps->num_negative_pics; i++)
            ret += !!rps->used[i];
        for (; i < rps->num_delta_pocs; i++)
            ret += !!rps->used[i];
    }

    if (long_rps) {
        for (i = 0; i < long_rps->nb_refs; i++)
            ret += !!long_rps->used[i];
    }
    return ret;
}